

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getAndInitPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,BtCursor *pCur,int bReadOnly)

{
  Pgno PVar1;
  void *pvVar2;
  DbPage *local_40;
  DbPage *pDbPage;
  int rc;
  int bReadOnly_local;
  BtCursor *pCur_local;
  MemPage **ppPage_local;
  BtShared *pBStack_18;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  pDbPage._4_4_ = bReadOnly;
  _rc = pCur;
  pCur_local = (BtCursor *)ppPage;
  ppPage_local._4_4_ = pgno;
  pBStack_18 = pBt;
  PVar1 = btreePagecount(pBt);
  if (PVar1 < pgno) {
    pDbPage._0_4_ = sqlite3CorruptError(0xff8c);
    goto LAB_002044e6;
  }
  pDbPage._0_4_ = sqlite3PagerGet(pBStack_18->pPager,ppPage_local._4_4_,&local_40,pDbPage._4_4_);
  if ((int)pDbPage != 0) goto LAB_002044e6;
  pvVar2 = sqlite3PagerGetExtra(local_40);
  *(void **)pCur_local = pvVar2;
  if (**(char **)pCur_local == '\0') {
    btreePageFromDbPage(local_40,ppPage_local._4_4_,pBStack_18);
    pDbPage._0_4_ = btreeInitPage(*(MemPage **)pCur_local);
    if ((int)pDbPage == 0) {
      pDbPage._0_4_ = 0;
      goto LAB_00204494;
    }
  }
  else {
LAB_00204494:
    if ((_rc == (BtCursor *)0x0) ||
       ((*(short *)(*(long *)pCur_local + 0x18) != 0 &&
        (*(u8 *)(*(long *)pCur_local + 2) == _rc->curIntKey)))) {
      return 0;
    }
    pDbPage._0_4_ = sqlite3CorruptError(0xffa1);
  }
  releasePage(*(MemPage **)pCur_local);
LAB_002044e6:
  if (_rc != (BtCursor *)0x0) {
    _rc->iPage = _rc->iPage + -1;
    _rc->pPage = _rc->apPage[_rc->iPage];
  }
  return (int)pDbPage;
}

Assistant:

static int getAndInitPage(
  BtShared *pBt,                  /* The database file */
  Pgno pgno,                      /* Number of the page to get */
  MemPage **ppPage,               /* Write the page pointer here */
  BtCursor *pCur,                 /* Cursor to receive the page, or NULL */
  int bReadOnly                   /* True for a read-only page */
){
  int rc;
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pCur==0 || ppPage==&pCur->pPage );
  assert( pCur==0 || bReadOnly==pCur->curPagerFlags );
  assert( pCur==0 || pCur->iPage>0 );

  if( pgno>btreePagecount(pBt) ){
    rc = SQLITE_CORRUPT_BKPT;
    goto getAndInitPage_error1;
  }
  rc = sqlite3PagerGet(pBt->pPager, pgno, (DbPage**)&pDbPage, bReadOnly);
  if( rc ){
    goto getAndInitPage_error1;
  }
  *ppPage = (MemPage*)sqlite3PagerGetExtra(pDbPage);
  if( (*ppPage)->isInit==0 ){
    btreePageFromDbPage(pDbPage, pgno, pBt);
    rc = btreeInitPage(*ppPage);
    if( rc!=SQLITE_OK ){
      goto getAndInitPage_error2;
    }
  }
  assert( (*ppPage)->pgno==pgno );
  assert( (*ppPage)->aData==sqlite3PagerGetData(pDbPage) );

  /* If obtaining a child page for a cursor, we must verify that the page is
  ** compatible with the root page. */
  if( pCur && ((*ppPage)->nCell<1 || (*ppPage)->intKey!=pCur->curIntKey) ){
    rc = SQLITE_CORRUPT_PGNO(pgno);
    goto getAndInitPage_error2;
  }
  return SQLITE_OK;

getAndInitPage_error2:
  releasePage(*ppPage);
getAndInitPage_error1:
  if( pCur ){
    pCur->iPage--;
    pCur->pPage = pCur->apPage[pCur->iPage];
  }
  testcase( pgno==0 );
  assert( pgno!=0 || rc==SQLITE_CORRUPT );
  return rc;
}